

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

double get_gamma(void)

{
  undefined8 uVar1;
  char *pcVar2;
  char *gamma_str;
  char *config;
  double gamma;
  double local_28;
  double local_10;
  double local_8;
  
  local_10 = -1.0;
  uVar1 = al_get_system_config();
  pcVar2 = (char *)al_get_config_value(uVar1,"image","png_screen_gamma");
  if (pcVar2 != (char *)0x0) {
    local_10 = strtod(pcVar2,(char **)0x0);
  }
  if ((local_10 != -1.0) || (NAN(local_10))) {
    local_8 = local_10;
  }
  else {
    pcVar2 = getenv("SCREEN_GAMMA");
    if (pcVar2 == (char *)0x0) {
      local_28 = 2.2;
    }
    else {
      local_28 = strtod(pcVar2,(char **)0x0);
    }
    local_8 = local_28;
  }
  return local_8;
}

Assistant:

static double get_gamma(void)
{
   double gamma = -1.0;
   const char* config = al_get_config_value(al_get_system_config(), "image", "png_screen_gamma");
   if (config) {
      gamma = strtod(config, NULL);
   }
   if (gamma == -1.0) {
      /* Use the environment variable if available.
       * 2.2 is a good guess for PC monitors.
       * 1.1 is good for my laptop.
       */
      const char *gamma_str = getenv("SCREEN_GAMMA");
      return (gamma_str) ? strtod(gamma_str, NULL) : 2.2;
   }

   return gamma;
}